

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result wabt::ValidateFuncSignatures(Module *module,Errors *errors,ValidateOptions *options)

{
  Result RVar1;
  undefined1 local_d8 [8];
  Validator validator;
  ValidateOptions *options_local;
  Errors *errors_local;
  Module *module_local;
  
  validator._168_8_ = options;
  anon_unknown_7::Validator::Validator((Validator *)local_d8,errors,(Script *)0x0,options);
  RVar1 = anon_unknown_7::Validator::CheckAllFuncSignatures((Validator *)local_d8,module);
  anon_unknown_7::Validator::~Validator((Validator *)local_d8);
  return (Result)RVar1.enum_;
}

Assistant:

Result ValidateFuncSignatures(const Module* module,
                              Errors* errors,
                              const ValidateOptions& options) {
  Validator validator(errors, nullptr, options);

  return validator.CheckAllFuncSignatures(module);
}